

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<const_args::ValueFlag<char,_args::ValueReader>_&>::streamReconstructedExpression
          (UnaryExpr<const_args::ValueFlag<char,_args::ValueReader>_&> *this,ostream *os)

{
  ValueFlag<char,_args::ValueReader> *in_RDX;
  type local_30;
  
  StringMaker<args::ValueFlag<char,args::ValueReader>,void>::
  convert<args::ValueFlag<char,args::ValueReader>>
            (&local_30,(StringMaker<args::ValueFlag<char,args::ValueReader>,void> *)this->m_lhs,
             in_RDX);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }